

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeRename(sqlite3_vtab *pVtab,char *zNewName)

{
  char *zSql_00;
  char *zSql;
  int rc;
  Rtree *pRtree;
  char *zNewName_local;
  sqlite3_vtab *pVtab_local;
  
  zSql._4_4_ = 7;
  zSql_00 = sqlite3_mprintf("ALTER TABLE %Q.\'%q_node\'   RENAME TO \"%w_node\";ALTER TABLE %Q.\'%q_parent\' RENAME TO \"%w_parent\";ALTER TABLE %Q.\'%q_rowid\'  RENAME TO \"%w_rowid\";"
                            ,pVtab[2].pModule,*(undefined8 *)&pVtab[2].nRef,zNewName,
                            pVtab[2].pModule,*(undefined8 *)&pVtab[2].nRef,zNewName,pVtab[2].pModule
                            ,*(undefined8 *)&pVtab[2].nRef,zNewName);
  if (zSql_00 != (char *)0x0) {
    nodeBlobReset((Rtree *)pVtab);
    zSql._4_4_ = sqlite3_exec((sqlite3 *)pVtab[1].pModule,zSql_00,(sqlite3_callback)0x0,(void *)0x0,
                              (char **)0x0);
    sqlite3_free(zSql_00);
  }
  return zSql._4_4_;
}

Assistant:

static int rtreeRename(sqlite3_vtab *pVtab, const char *zNewName){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_NOMEM;
  char *zSql = sqlite3_mprintf(
    "ALTER TABLE %Q.'%q_node'   RENAME TO \"%w_node\";"
    "ALTER TABLE %Q.'%q_parent' RENAME TO \"%w_parent\";"
    "ALTER TABLE %Q.'%q_rowid'  RENAME TO \"%w_rowid\";"
    , pRtree->zDb, pRtree->zName, zNewName 
    , pRtree->zDb, pRtree->zName, zNewName 
    , pRtree->zDb, pRtree->zName, zNewName
  );
  if( zSql ){
    nodeBlobReset(pRtree);
    rc = sqlite3_exec(pRtree->db, zSql, 0, 0, 0);
    sqlite3_free(zSql);
  }
  return rc;
}